

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteObjectDependRules
          (cmMakefileTargetGenerator *this,cmSourceFile *source,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *__x;
  char *pcVar1;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  char *local_28;
  char *objectDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmSourceFile *source_local;
  cmMakefileTargetGenerator *this_local;
  
  objectDeps = (char *)depends;
  depends_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)source;
  source_local = (cmSourceFile *)this;
  __x = cmSourceFile::GetFullPath_abi_cxx11_(source);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(depends,__x);
  this_00 = depends_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"OBJECT_DEPENDS",&local_49);
  pcVar1 = cmSourceFile::GetProperty((cmSourceFile *)this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    cmSystemTools::ExpandListArgument
              (&local_80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)objectDeps,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator
::WriteObjectDependRules(cmSourceFile const& source,
                         std::vector<std::string>& depends)
{
  // Create the list of dependencies known at cmake time.  These are
  // shared between the object file and dependency scanning rule.
  depends.push_back(source.GetFullPath());
  if(const char* objectDeps = source.GetProperty("OBJECT_DEPENDS"))
    {
    cmSystemTools::ExpandListArgument(objectDeps, depends);
    }
}